

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::python::Generator::Generator(Generator *this)

{
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__Generator_004de310;
  (this->mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).mu_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).mu_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->file_ = (FileDescriptor *)0x0;
  (this->file_descriptor_serialized_)._M_dataplus._M_p =
       (pointer)&(this->file_descriptor_serialized_).field_2;
  (this->file_descriptor_serialized_)._M_string_length = 0;
  (this->file_descriptor_serialized_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Generator::Generator() : file_(nullptr) {}